

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

void __thiscall pbrt::CameraBase::FindMinimumDifferentials(CameraBase *this,CameraHandle *camera)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  bool bVar17;
  int iVar18;
  CameraRayDifferential *pCVar19;
  long in_RDI;
  float fVar20;
  type tVar21;
  type tVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  Vector3<float> VVar26;
  Vector3f VVar27;
  Tuple3<pbrt::Vector3,_float> TVar28;
  Tuple3<pbrt::Vector3,_float> TVar29;
  Tuple3<pbrt::Vector3,_float> TVar30;
  Vector3f dyf;
  Vector3f dxf;
  Vector3f df;
  Frame f;
  Vector3f doy;
  Vector3f dox;
  RayDifferential *ray;
  optional<pbrt::CameraRayDifferential> crd;
  int i;
  int n;
  SampledWavelengths lambda;
  CameraSample sample;
  float in_stack_fffffffffffffa98;
  float in_stack_fffffffffffffa9c;
  undefined4 in_stack_fffffffffffffaa0;
  float in_stack_fffffffffffffaa4;
  undefined8 in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffab0;
  Float in_stack_fffffffffffffab4;
  undefined4 in_stack_fffffffffffffab8;
  type in_stack_fffffffffffffabc;
  type in_stack_fffffffffffffac0;
  float in_stack_fffffffffffffac4;
  undefined8 in_stack_fffffffffffffac8;
  Vector3<float> *in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffae0;
  float in_stack_fffffffffffffae4;
  undefined8 in_stack_fffffffffffffae8;
  undefined4 uStack_510;
  int in_stack_fffffffffffffaf4;
  undefined4 in_stack_fffffffffffffaf8;
  type in_stack_fffffffffffffafc;
  float in_stack_fffffffffffffb04;
  optional local_f0 [124];
  Tuple2<pbrt::Point2,_int> local_74;
  Tuple2<pbrt::Point2,_int> local_6c;
  int local_64;
  int local_60;
  undefined8 local_3c;
  float local_34;
  float local_30;
  undefined8 local_2c;
  undefined4 local_24;
  undefined8 local_1c;
  undefined4 local_14;
  
  Vector3<float>::Vector3
            ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
             in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98,0.0);
  *(undefined8 *)(in_RDI + 0x374) = local_1c;
  *(undefined4 *)(in_RDI + 0x37c) = local_14;
  *(undefined8 *)(in_RDI + 0x368) = *(undefined8 *)(in_RDI + 0x374);
  *(undefined4 *)(in_RDI + 0x370) = *(undefined4 *)(in_RDI + 0x37c);
  *(undefined8 *)(in_RDI + 0x35c) = *(undefined8 *)(in_RDI + 0x368);
  *(undefined4 *)(in_RDI + 0x364) = *(undefined4 *)(in_RDI + 0x370);
  *(undefined8 *)(in_RDI + 0x350) = *(undefined8 *)(in_RDI + 0x35c);
  *(undefined4 *)(in_RDI + 0x358) = *(undefined4 *)(in_RDI + 0x364);
  CameraSample::CameraSample
            ((CameraSample *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
  Point2<float>::Point2
            ((Point2<float> *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
             in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98);
  local_2c = local_3c;
  local_24 = 0x3f000000;
  SampledWavelengths::SampleXYZ(in_stack_fffffffffffffab4);
  TVar28.z = in_stack_fffffffffffffae4;
  TVar28.x = (float)(int)in_stack_fffffffffffffae8;
  TVar28.y = (float)(int)((ulong)in_stack_fffffffffffffae8 >> 0x20);
  TVar29.z = in_stack_fffffffffffffac4;
  TVar29.x = (float)(int)in_stack_fffffffffffffac8;
  TVar29.y = (float)(int)((ulong)in_stack_fffffffffffffac8 >> 0x20);
  TVar30.z = in_stack_fffffffffffffaa4;
  TVar30.x = (float)(int)in_stack_fffffffffffffaa8;
  TVar30.y = (float)(int)((ulong)in_stack_fffffffffffffaa8 >> 0x20);
  local_60 = 0x200;
  local_64 = 0;
  while( true ) {
    if (local_60 <= local_64) break;
    fVar20 = (float)local_64;
    iVar18 = local_60 + -1;
    local_6c = (Tuple2<pbrt::Point2,_int>)
               FilmHandle::FullResolution
                         ((FilmHandle *)
                          CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
    local_34 = (fVar20 / (float)iVar18) * (float)local_6c.x;
    fVar20 = (float)local_64;
    iVar18 = local_60 + -1;
    local_74 = (Tuple2<pbrt::Point2,_int>)
               FilmHandle::FullResolution
                         ((FilmHandle *)
                          CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
    local_30 = (fVar20 / (float)iVar18) * (float)local_74.y;
    uVar23 = 0;
    CameraHandle::GenerateRayDifferential
              (TVar29._0_8_,(CameraSample *)CONCAT44(TVar29.z,in_stack_fffffffffffffac0),
               (SampledWavelengths *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
    bVar17 = pstd::optional::operator_cast_to_bool(local_f0);
    if (bVar17) {
      pCVar19 = pstd::optional<pbrt::CameraRayDifferential>::operator->
                          ((optional<pbrt::CameraRayDifferential> *)0x68c8c4);
      VVar26 = Point3<float>::operator-
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),TVar30._0_8_
                         );
      auVar16._8_8_ = uVar23;
      auVar16._0_8_ = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      vmovlpd_avx(auVar16);
      uVar23 = 0;
      VVar27 = CameraFromRender((CameraBase *)CONCAT44(TVar29.z,in_stack_fffffffffffffac0),
                                (Vector3f *)
                                CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                                in_stack_fffffffffffffab4);
      auVar15._8_8_ = uVar23;
      auVar15._0_8_ = VVar27.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      uVar23 = vmovlpd_avx(auVar15);
      tVar21 = Length<float>((Vector3<float> *)0x68c9cd);
      tVar22 = Length<float>((Vector3<float> *)0x68c9ec);
      uVar24 = 0;
      if (tVar21 < tVar22) {
        *(undefined8 *)(in_RDI + 0x350) = uVar23;
        *(float *)(in_RDI + 0x358) = VVar27.super_Tuple3<pbrt::Vector3,_float>.z;
      }
      VVar26 = Point3<float>::operator-
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),TVar30._0_8_
                         );
      auVar14._8_8_ = uVar24;
      auVar14._0_8_ = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      vmovlpd_avx(auVar14);
      uVar23 = 0;
      VVar27 = CameraFromRender((CameraBase *)CONCAT44(TVar29.z,in_stack_fffffffffffffac0),
                                (Vector3f *)
                                CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                                in_stack_fffffffffffffab4);
      auVar13._8_8_ = uVar23;
      auVar13._0_8_ = VVar27.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      uVar23 = vmovlpd_avx(auVar13);
      tVar21 = Length<float>((Vector3<float> *)0x68cb22);
      tVar22 = Length<float>((Vector3<float> *)0x68cb41);
      uVar24 = 0;
      if (tVar21 < tVar22) {
        *(undefined8 *)(in_RDI + 0x35c) = uVar23;
        *(float *)(in_RDI + 0x364) = VVar27.super_Tuple3<pbrt::Vector3,_float>.z;
      }
      VVar26 = Normalize<float>((Vector3<float> *)CONCAT44(TVar29.z,in_stack_fffffffffffffac0));
      uVar25 = 0;
      auVar12._8_8_ = uVar24;
      auVar12._0_8_ = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      uVar23 = vmovlpd_avx(auVar12);
      (pCVar19->ray).super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z =
           VVar26.super_Tuple3<pbrt::Vector3,_float>.z;
      (pCVar19->ray).super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar23;
      (pCVar19->ray).super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar23 >> 0x20);
      VVar26 = Normalize<float>((Vector3<float> *)CONCAT44(TVar29.z,in_stack_fffffffffffffac0));
      uVar24 = 0;
      auVar11._8_8_ = uVar25;
      auVar11._0_8_ = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      uVar23 = vmovlpd_avx(auVar11);
      (pCVar19->ray).rxDirection.super_Tuple3<pbrt::Vector3,_float>.z =
           VVar26.super_Tuple3<pbrt::Vector3,_float>.z;
      (pCVar19->ray).rxDirection.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar23;
      (pCVar19->ray).rxDirection.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar23 >> 0x20);
      VVar26 = Normalize<float>((Vector3<float> *)CONCAT44(TVar29.z,in_stack_fffffffffffffac0));
      uVar25 = 0;
      auVar10._8_8_ = uVar24;
      auVar10._0_8_ = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      uVar23 = vmovlpd_avx(auVar10);
      (pCVar19->ray).ryDirection.super_Tuple3<pbrt::Vector3,_float>.z =
           VVar26.super_Tuple3<pbrt::Vector3,_float>.z;
      (pCVar19->ray).ryDirection.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar23;
      (pCVar19->ray).ryDirection.super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar23 >> 0x20);
      Frame::FromZ((Vector3f *)CONCAT44(TVar29.z,in_stack_fffffffffffffac0));
      VVar27 = Frame::ToLocal((Frame *)CONCAT44(TVar29.z,in_stack_fffffffffffffac0),
                              (Vector3f *)
                              CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
      uVar23 = 0;
      auVar9._8_8_ = uVar25;
      auVar9._0_8_ = VVar27.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      vmovlpd_avx(auVar9);
      VVar27 = Frame::ToLocal((Frame *)CONCAT44(TVar29.z,in_stack_fffffffffffffac0),
                              (Vector3f *)
                              CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
      uVar24 = 0;
      auVar8._8_8_ = uVar23;
      auVar8._0_8_ = VVar27.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      vmovlpd_avx(auVar8);
      VVar26 = Normalize<float>((Vector3<float> *)CONCAT44(TVar29.z,in_stack_fffffffffffffac0));
      uVar23 = 0;
      auVar7._8_8_ = uVar24;
      auVar7._0_8_ = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      vmovlpd_avx(auVar7);
      VVar27 = Frame::ToLocal((Frame *)CONCAT44(TVar29.z,in_stack_fffffffffffffac0),
                              (Vector3f *)
                              CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
      uVar24 = 0;
      auVar6._8_8_ = uVar23;
      auVar6._0_8_ = VVar27.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      vmovlpd_avx(auVar6);
      VVar26 = Normalize<float>((Vector3<float> *)CONCAT44(TVar29.z,in_stack_fffffffffffffac0));
      uVar23 = 0;
      auVar5._8_8_ = uVar24;
      auVar5._0_8_ = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      vmovlpd_avx(auVar5);
      VVar26 = Tuple3<pbrt::Vector3,float>::operator-
                         ((Tuple3<pbrt::Vector3,_float> *)
                          CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),TVar30._0_8_
                         );
      in_stack_fffffffffffffb04 = VVar26.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar4._8_8_ = uVar23;
      auVar4._0_8_ = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      vmovlpd_avx(auVar4);
      tVar21 = Length<float>((Vector3<float> *)0x68cfb1);
      in_stack_fffffffffffffafc = Length<float>((Vector3<float> *)0x68cfcd);
      uVar23 = 0;
      if (tVar21 < in_stack_fffffffffffffafc) {
        TVar28 = (Tuple3<pbrt::Vector3,_float>)
                 Tuple3<pbrt::Vector3,float>::operator-
                           ((Tuple3<pbrt::Vector3,_float> *)
                            CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                            TVar30._0_8_);
        uStack_510 = (undefined4)uVar23;
        in_stack_fffffffffffffaf4 = (int)((ulong)uVar23 >> 0x20);
        auVar3._8_4_ = uStack_510;
        auVar3._0_8_ = TVar28._0_8_;
        auVar3._12_4_ = in_stack_fffffffffffffaf4;
        uVar23 = vmovlpd_avx(auVar3);
        *(undefined8 *)(in_RDI + 0x368) = uVar23;
        *(float *)(in_RDI + 0x370) = TVar28.z;
      }
      uVar23 = 0;
      TVar29 = (Tuple3<pbrt::Vector3,_float>)
               Tuple3<pbrt::Vector3,float>::operator-
                         ((Tuple3<pbrt::Vector3,_float> *)
                          CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),TVar30._0_8_
                         );
      auVar2._8_8_ = uVar23;
      auVar2._0_8_ = TVar29._0_8_;
      vmovlpd_avx(auVar2);
      in_stack_fffffffffffffac0 = Length<float>((Vector3<float> *)0x68d0da);
      in_stack_fffffffffffffabc = Length<float>((Vector3<float> *)0x68d0f6);
      uVar23 = 0;
      if (in_stack_fffffffffffffac0 < in_stack_fffffffffffffabc) {
        TVar30 = (Tuple3<pbrt::Vector3,_float>)
                 Tuple3<pbrt::Vector3,float>::operator-
                           ((Tuple3<pbrt::Vector3,_float> *)
                            CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                            TVar30._0_8_);
        in_stack_fffffffffffffab0 = (undefined4)uVar23;
        in_stack_fffffffffffffab4 = (Float)((ulong)uVar23 >> 0x20);
        auVar1._8_4_ = in_stack_fffffffffffffab0;
        auVar1._0_8_ = TVar30._0_8_;
        auVar1._12_4_ = in_stack_fffffffffffffab4;
        uVar23 = vmovlpd_avx(auVar1);
        *(undefined8 *)(in_RDI + 0x374) = uVar23;
        *(float *)(in_RDI + 0x37c) = TVar30.z;
      }
    }
    pstd::optional<pbrt::CameraRayDifferential>::~optional
              ((optional<pbrt::CameraRayDifferential> *)0x68d1af);
    local_64 = local_64 + 1;
  }
  if (LOGGING_LogLevel < 1) {
    Log<pbrt::Vector3<float>&,pbrt::Vector3<float>&>
              ((LogLevel)in_stack_fffffffffffffb04,
               (char *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
               in_stack_fffffffffffffaf4,TVar28._0_8_,
               (Vector3<float> *)CONCAT44(TVar28.z,in_stack_fffffffffffffae0),
               in_stack_fffffffffffffad8);
  }
  if (LOGGING_LogLevel < 1) {
    Log<pbrt::Vector3<float>&,pbrt::Vector3<float>&>
              ((LogLevel)in_stack_fffffffffffffb04,
               (char *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
               in_stack_fffffffffffffaf4,TVar28._0_8_,
               (Vector3<float> *)CONCAT44(TVar28.z,in_stack_fffffffffffffae0),
               in_stack_fffffffffffffad8);
  }
  return;
}

Assistant:

void CameraBase::FindMinimumDifferentials(CameraHandle camera) {
    minPosDifferentialX = minPosDifferentialY = minDirDifferentialX =
        minDirDifferentialY = Vector3f(Infinity, Infinity, Infinity);

    CameraSample sample;
    sample.pLens = Point2f(0.5, 0.5);
    sample.time = 0.5;
    SampledWavelengths lambda = SampledWavelengths::SampleXYZ(0.5);

    int n = 512;
    for (int i = 0; i < n; ++i) {
        sample.pFilm.x = Float(i) / (n - 1) * film.FullResolution().x;
        sample.pFilm.y = Float(i) / (n - 1) * film.FullResolution().y;

        pstd::optional<CameraRayDifferential> crd =
            camera.GenerateRayDifferential(sample, lambda);
        if (!crd)
            continue;

        RayDifferential &ray = crd->ray;
        Vector3f dox = CameraFromRender(ray.rxOrigin - ray.o, ray.time);
        if (Length(dox) < Length(minPosDifferentialX))
            minPosDifferentialX = dox;
        Vector3f doy = CameraFromRender(ray.ryOrigin - ray.o, ray.time);
        if (Length(doy) < Length(minPosDifferentialY))
            minPosDifferentialY = doy;

        ray.d = Normalize(ray.d);
        ray.rxDirection = Normalize(ray.rxDirection);
        ray.ryDirection = Normalize(ray.ryDirection);

        Frame f = Frame::FromZ(ray.d);
        Vector3f df = f.ToLocal(ray.d);  // should be (0, 0, 1);
        Vector3f dxf = Normalize(f.ToLocal(ray.rxDirection));
        Vector3f dyf = Normalize(f.ToLocal(ray.ryDirection));

        if (Length(dxf - df) < Length(minDirDifferentialX))
            minDirDifferentialX = dxf - df;
        if (Length(dyf - df) < Length(minDirDifferentialY))
            minDirDifferentialY = dyf - df;
    }

    LOG_VERBOSE("Camera min pos differentials: %s, %s", minPosDifferentialX,
                minPosDifferentialY);
    LOG_VERBOSE("Camera min dir differentials: %s, %s", minDirDifferentialX,
                minDirDifferentialY);
}